

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileDisposal.cpp
# Opt level: O1

void printPdb(Particle *particle)

{
  int iVar1;
  double *pdVar2;
  char *pcVar3;
  FILE *__stream;
  char *pcVar4;
  ostream *poVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  
  pcVar3 = catStrIntStr(energyFileAddress,"tempFile/temp",particle->index,".pdb");
  __stream = fopen(pcVar3,"w");
  if (__stream != (FILE *)0x0) {
    iVar1 = particle->numAA;
    if (0 < (long)iVar1) {
      uVar6 = 4;
      lVar7 = 0;
      lVar8 = 0;
      do {
        pcVar4 = getRelativeAA(particle->seq[lVar8]);
        uVar9 = (int)lVar8 + 1;
        pdVar2 = particle->addO_origin;
        fprintf(__stream,"ATOM   %4d  N   %3s   %3d    %8.3f%8.3f%8.3f  1.00  0.00\n",
                *(undefined8 *)((long)pdVar2 + lVar7),*(undefined8 *)((long)pdVar2 + lVar7 + 8),
                *(undefined8 *)((long)pdVar2 + lVar7 + 0x10),(ulong)(uVar6 - 3),pcVar4,(ulong)uVar9)
        ;
        pdVar2 = particle->addO_origin;
        fprintf(__stream,"ATOM   %4d  CA  %3s   %3d    %8.3f%8.3f%8.3f  1.00  0.00\n",
                *(undefined8 *)((long)pdVar2 + lVar7 + 0x18),
                *(undefined8 *)((long)pdVar2 + lVar7 + 0x20),
                *(undefined8 *)((long)pdVar2 + lVar7 + 0x28),(ulong)(uVar6 - 2),pcVar4,(ulong)uVar9)
        ;
        pdVar2 = particle->addO_origin;
        fprintf(__stream,"ATOM   %4d  C   %3s   %3d    %8.3f%8.3f%8.3f  1.00  0.00\n",
                *(undefined8 *)((long)pdVar2 + lVar7 + 0x30),
                *(undefined8 *)((long)pdVar2 + lVar7 + 0x38),
                *(undefined8 *)((long)pdVar2 + lVar7 + 0x40),(ulong)(uVar6 - 1),pcVar4,(ulong)uVar9)
        ;
        pdVar2 = particle->addO_origin;
        fprintf(__stream,"ATOM   %4d  O   %3s   %3d    %8.3f%8.3f%8.3f  1.00  0.00\n",
                *(undefined8 *)((long)pdVar2 + lVar7 + 0x48),
                *(undefined8 *)((long)pdVar2 + lVar7 + 0x50),
                *(undefined8 *)((long)pdVar2 + lVar7 + 0x58),(ulong)uVar6,pcVar4,(ulong)uVar9);
        if (pcVar4 != (char *)0x0) {
          operator_delete(pcVar4);
        }
        uVar6 = uVar6 + 4;
        lVar7 = lVar7 + 0x60;
        lVar8 = lVar8 + 1;
      } while ((long)iVar1 * 0x60 != lVar7);
    }
    fclose(__stream);
    pcVar4 = catStrIntStr(energyFileAddress,"tempFile/temp_",particle->index,".pdb");
    pcVar3 = catStrStr(refine_1Address,"scrwl4/Scwrl4 -i ",pcVar3," -o ",pcVar4);
    system(pcVar3);
    return;
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"Can\'t write temp.pdb");
  std::endl<char,std::char_traits<char>>(poVar5);
  exit(-1);
}

Assistant:

void printPdb(Particle * particle){
    FILE * output;
    //cout << "index= " << particle->index << endl;
    //const char *fileName = catStrIntStr("/home/ws/zzZyj/data/energyFile/tempFile/temp", particle->index, ".pdb");
    const char *fileName = catStrIntStr(energyFileAddress,"tempFile/temp", particle->index, ".pdb");
    output = fopen(fileName, "w");
    if (output == NULL) {
        cout << "Can't write temp.pdb" << endl;
        exit(-1);
    }
    int lenOfAA = particle->numAA;
    for (int i=0; i<lenOfAA; i++){
        char *AA = getRelativeAA(particle->seq[i]);
        int k1 = i*4*3, k2 = i*4*3+3, k3 = i*4*3+6, k4 = i*4*3+9;
        fprintf(output, "ATOM   %4d  N   %3s   %3d    %8.3f%8.3f%8.3f  1.00  0.00\n",
                4*i+1, AA, i+1, particle->addO_origin[k1], particle->addO_origin[k1+1], particle->addO_origin[k1+2]);
        fprintf(output, "ATOM   %4d  CA  %3s   %3d    %8.3f%8.3f%8.3f  1.00  0.00\n",
                4*i+2, AA, i+1, particle->addO_origin[k2], particle->addO_origin[k2+1], particle->addO_origin[k2+2]);
        fprintf(output, "ATOM   %4d  C   %3s   %3d    %8.3f%8.3f%8.3f  1.00  0.00\n",
                4*i+3, AA, i+1, particle->addO_origin[k3], particle->addO_origin[k3+1], particle->addO_origin[k3+2]);
        fprintf(output, "ATOM   %4d  O   %3s   %3d    %8.3f%8.3f%8.3f  1.00  0.00\n",
                4*i+4, AA, i+1, particle->addO_origin[k4], particle->addO_origin[k4+1], particle->addO_origin[k4+2]);
        delete AA;
    }
    fclose(output);
    //system("/home/ws/GL/refine1/scrwl4/Scwrl4 -i /home/ws/zzZyj/data/temp.pdb -o /home/ws/zzZyj/data/temp1.pdb");
    //const char *newFile = catStrIntStr("/home/ws/zzZyj/data/energyFile/tempFile/temp_", particle->index, ".pdb");
    const char *newFile = catStrIntStr(energyFileAddress,"tempFile/temp_", particle->index, ".pdb");
    const char *command = catStrStr(refine_1Address, "scrwl4/Scwrl4 -i ", fileName,
                                    " -o ", newFile);
    system(command);
}